

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

Id __thiscall
anon_unknown.dwarf_a4b191::TGlslangToSpvTraverser::createAtomicOperation
          (TGlslangToSpvTraverser *this,TOperator op,Decoration param_2,Id typeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operands,TBasicType typeProxy,
          CoherentFlags *lvalueCoherentFlags,TType *opType)

{
  value_type_conflict *pvVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  Decoration typeId_00;
  int iVar10;
  Id IVar11;
  Id resultId;
  uint uVar12;
  uint uVar13;
  Id IVar14;
  undefined4 in_register_0000000c;
  long *plVar15;
  Capability CVar16;
  Id *__x;
  undefined4 in_register_0000008c;
  Builder *pBVar17;
  Op local_8c;
  Id semanticsId;
  Id local_70;
  Id valueId;
  Decoration local_68;
  Id semanticsId2;
  Id compareId;
  value_type_conflict local_5c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> spvAtomicOperands;
  
  plVar15 = (long *)CONCAT44(in_register_0000000c,typeId);
  bVar4 = 1;
  uVar12 = (uint)operands;
  local_68 = param_2;
  switch(op) {
  case EOpAtomicAdd:
  case EOpAtomicCounterAdd:
    goto switchD_0034e102_caseD_12d;
  case EOpAtomicSubtract:
  case EOpAtomicCounterSubtract:
    local_8c = OpAtomicISub;
    break;
  case EOpAtomicMin:
  case EOpAtomicCounterMin:
switchD_0034e102_caseD_12f:
    if (2 < uVar12 - 1) {
      local_8c = (uVar12 & 0xfffffffd) == 9 | OpAtomicSMin;
      break;
    }
    if ((uVar12 != 3) ||
       ((iVar10 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags),
        iVar10 != 2 &&
        (iVar10 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags),
        iVar10 != 4)))) {
      spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_atomic_float_min_max");
      if (uVar12 == 3) {
        CVar16 = AtomicFloat16MinMaxEXT;
      }
      else if (uVar12 == 1) {
        CVar16 = AtomicFloat32MinMaxEXT;
      }
      else {
        CVar16 = AtomicFloat64MinMaxEXT;
      }
      spv::Builder::addCapability(&this->builder,CVar16);
      local_8c = OpAtomicFMinEXT;
      goto LAB_0034e8d4;
    }
    spv::Builder::addExtension(&this->builder,"SPV_NV_shader_atomic_fp16_vector");
    spv::Builder::addCapability(&this->builder,AtomicFloat16VectorNV);
    local_8c = OpAtomicFMinEXT;
    goto LAB_0034e30b;
  case EOpAtomicMax:
  case EOpAtomicCounterMax:
switchD_0034e102_caseD_130:
    if (2 < uVar12 - 1) {
      local_8c = (uVar12 & 0xfffffffd) == 9 | OpAtomicSMax;
      break;
    }
    if ((uVar12 == 3) &&
       ((iVar10 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags),
        iVar10 == 2 ||
        (iVar10 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags),
        iVar10 == 4)))) {
      spv::Builder::addExtension(&this->builder,"SPV_NV_shader_atomic_fp16_vector");
      spv::Builder::addCapability(&this->builder,AtomicFloat16VectorNV);
      local_8c = OpAtomicFMaxEXT;
      goto LAB_0034e30b;
    }
    spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_atomic_float_min_max");
    if (uVar12 == 3) {
      CVar16 = AtomicFloat16MinMaxEXT;
    }
    else if (uVar12 == 1) {
      CVar16 = AtomicFloat32MinMaxEXT;
    }
    else {
      CVar16 = AtomicFloat64MinMaxEXT;
    }
    spv::Builder::addCapability(&this->builder,CVar16);
    local_8c = OpAtomicFMaxEXT;
    goto LAB_0034e8d4;
  case EOpAtomicAnd:
  case EOpAtomicCounterAnd:
switchD_0034e102_caseD_131:
    local_8c = OpAtomicAnd;
    break;
  case EOpAtomicOr:
  case EOpAtomicCounterOr:
switchD_0034e102_caseD_132:
    local_8c = OpAtomicOr;
    break;
  case EOpAtomicXor:
  case EOpAtomicCounterXor:
switchD_0034e102_caseD_133:
    local_8c = OpAtomicXor;
    break;
  case EOpAtomicExchange:
  case EOpAtomicCounterExchange:
switchD_0034e102_caseD_134:
    if (uVar12 == 3) {
      iVar10 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags);
      if ((iVar10 == 2) ||
         (iVar10 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags),
         iVar10 == 4)) {
        spv::Builder::addExtension(&this->builder,"SPV_NV_shader_atomic_fp16_vector");
        spv::Builder::addCapability(&this->builder,AtomicFloat16VectorNV);
      }
      local_8c = OpAtomicExchange;
      goto LAB_0034e30b;
    }
    local_8c = OpAtomicExchange;
    break;
  case EOpAtomicCompSwap:
  case EOpAtomicCounterCompSwap:
switchD_0034e102_caseD_135:
    local_8c = OpAtomicCompareExchange;
    bVar9 = true;
    bVar8 = false;
    bVar4 = 1;
    goto LAB_0034e3e8;
  case EOpAtomicLoad:
  case EOpAtomicCounter:
switchD_0034e102_caseD_136:
    local_8c = OpAtomicLoad;
    bVar8 = true;
    bVar9 = false;
    bVar4 = 0;
    goto LAB_0034e3e8;
  case EOpAtomicStore:
switchD_0034e102_caseD_137:
    local_8c = OpAtomicStore;
    bVar4 = 1;
    bVar3 = false;
    bVar2 = false;
    bVar9 = false;
    bVar8 = false;
    bVar5 = 1;
    bVar6 = 1;
    bVar7 = true;
    goto LAB_0034e3fc;
  case EOpAtomicCounterIncrement:
    local_8c = OpAtomicIIncrement;
    bVar3 = true;
    bVar9 = false;
    bVar8 = false;
    bVar4 = 1;
    bVar5 = 0;
    goto LAB_0034e3ee;
  case EOpAtomicCounterDecrement:
    local_8c = OpAtomicIDecrement;
    bVar2 = true;
    bVar3 = false;
    bVar9 = false;
    bVar8 = false;
    bVar4 = 1;
    bVar5 = 1;
    bVar6 = 0;
    goto LAB_0034e3f4;
  default:
    switch(op) {
    case EOpImageAtomicAdd:
      goto switchD_0034e102_caseD_12d;
    case EOpImageAtomicMin:
      goto switchD_0034e102_caseD_12f;
    case EOpImageAtomicMax:
      goto switchD_0034e102_caseD_130;
    case EOpImageAtomicAnd:
      goto switchD_0034e102_caseD_131;
    case EOpImageAtomicOr:
      goto switchD_0034e102_caseD_132;
    case EOpImageAtomicXor:
      goto switchD_0034e102_caseD_133;
    case EOpImageAtomicExchange:
      goto switchD_0034e102_caseD_134;
    case EOpImageAtomicCompSwap:
      goto switchD_0034e102_caseD_135;
    case EOpImageAtomicLoad:
      goto switchD_0034e102_caseD_136;
    case EOpImageAtomicStore:
      goto switchD_0034e102_caseD_137;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x20a1,
                    "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createAtomicOperation(glslang::TOperator, spv::Decoration, spv::Id, std::vector<spv::Id> &, glslang::TBasicType, const spv::Builder::AccessChain::CoherentFlags &, const glslang::TType &)"
                   );
    }
  }
LAB_0034e3d2:
  bVar9 = false;
  bVar8 = false;
LAB_0034e3e8:
  bVar3 = false;
  bVar5 = 1;
LAB_0034e3ee:
  bVar2 = false;
  bVar6 = 1;
LAB_0034e3f4:
  bVar7 = false;
LAB_0034e3fc:
  if ((uVar12 & 0xfffffffe) == 10) {
    spv::Builder::addCapability(&this->builder,CapabilityInt64Atomics);
  }
LAB_0034e414:
  compareId = 0;
  valueId = 0;
  pBVar17 = &this->builder;
  uVar12 = 0;
  IVar11 = spv::Builder::makeUintConstant
                     (pBVar17,(uint)this->glslangIntermediate->useVulkanMemoryModel * 4 + 1,false);
  if ((*(byte *)CONCAT44(in_register_0000008c,typeProxy) & 0x80) != 0) {
    uVar12 = (uint)this->glslangIntermediate->useVulkanMemoryModel << 0xf;
  }
  local_70 = IVar11;
  resultId = spv::Builder::makeUintConstant(pBVar17,uVar12,false);
  typeId_00 = local_68;
  pvVar1 = (value_type_conflict *)*plVar15;
  local_5c = *pvVar1;
  IVar14 = resultId;
  semanticsId = resultId;
  semanticsId2 = resultId;
  if (!bVar2 && !bVar3) {
    if (bVar9) {
      compareId = pvVar1[1];
      valueId = pvVar1[2];
      if (0xc < (ulong)(plVar15[1] - (long)pvVar1)) {
        IVar11 = pvVar1[3];
        local_70 = IVar11;
        uVar12 = spv::Builder::getConstantScalar(pBVar17,pvVar1[4]);
        uVar13 = spv::Builder::getConstantScalar(pBVar17,*(Id *)(*plVar15 + 0x14));
        IVar14 = spv::Builder::makeUintConstant(pBVar17,uVar12 | uVar13,false);
        semanticsId = IVar14;
        uVar12 = spv::Builder::getConstantScalar(pBVar17,*(Id *)(*plVar15 + 0x18));
        uVar13 = spv::Builder::getConstantScalar(pBVar17,*(Id *)(*plVar15 + 0x1c));
        resultId = spv::Builder::makeUintConstant(pBVar17,uVar12 | uVar13,false);
        semanticsId2 = resultId;
      }
    }
    else if (bVar8) {
      if (4 < (ulong)(plVar15[1] - (long)pvVar1)) {
        IVar11 = pvVar1[1];
        local_70 = IVar11;
        uVar12 = spv::Builder::getConstantScalar(pBVar17,pvVar1[2]);
        IVar14 = *(Id *)(*plVar15 + 0xc);
LAB_0034e75e:
        uVar13 = spv::Builder::getConstantScalar(pBVar17,IVar14);
        IVar14 = spv::Builder::makeUintConstant(pBVar17,uVar12 | uVar13,false);
        semanticsId = IVar14;
      }
    }
    else {
      valueId = pvVar1[1];
      if (8 < (ulong)(plVar15[1] - (long)pvVar1)) {
        IVar11 = pvVar1[2];
        local_70 = IVar11;
        uVar12 = spv::Builder::getConstantScalar(pBVar17,pvVar1[3]);
        IVar14 = *(Id *)(*plVar15 + 0x10);
        goto LAB_0034e75e;
      }
    }
  }
  uVar12 = spv::Builder::getConstantScalar(pBVar17,IVar14);
  uVar13 = spv::Builder::getConstantScalar(pBVar17,resultId);
  if (((uVar13 | uVar12) & 0xf000) != 0) {
    spv::Builder::addCapability(pBVar17,CapabilityVulkanMemoryModel);
  }
  uVar12 = spv::Builder::getConstantScalar(pBVar17,IVar11);
  if (uVar12 == 5) {
    spv::Builder::addCapability(pBVar17,CapabilityVulkanMemoryModel);
  }
  if ((this->glslangIntermediate->useVulkanMemoryModel == true) &&
     (uVar12 = spv::Builder::getConstantScalar(pBVar17,IVar11), uVar12 == 1)) {
    spv::Builder::addCapability(pBVar17,CapabilityVulkanMemoryModelDeviceScope);
  }
  spvAtomicOperands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  spvAtomicOperands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  spvAtomicOperands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&spvAtomicOperands,6);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&spvAtomicOperands,&local_5c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&spvAtomicOperands,&local_70);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&spvAtomicOperands,&semanticsId);
  if (bVar9) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&spvAtomicOperands,&semanticsId2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&spvAtomicOperands,&valueId)
    ;
    __x = &compareId;
  }
  else {
    if (!(bool)(bVar6 & bVar5 & bVar4)) goto LAB_0034e66c;
    __x = &valueId;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&spvAtomicOperands,__x);
LAB_0034e66c:
  if (bVar7) {
    spv::Builder::createNoResultOp(pBVar17,OpAtomicStore,&spvAtomicOperands);
    IVar11 = 0;
  }
  else {
    IVar11 = spv::Builder::createOp(pBVar17,local_8c,typeId_00,&spvAtomicOperands);
    if (op == EOpAtomicCounterDecrement) {
      IVar14 = spv::Builder::makeIntConstant(pBVar17,1,false);
      IVar11 = spv::Builder::createBinOp(pBVar17,OpISub,typeId_00,IVar11,IVar14);
    }
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&spvAtomicOperands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return IVar11;
switchD_0034e102_caseD_12d:
  if (2 < uVar12 - 1) {
    local_8c = OpAtomicIAdd;
    goto LAB_0034e3d2;
  }
  if ((uVar12 == 3) &&
     ((iVar10 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags), iVar10 == 2
      || (iVar10 = (**(code **)(*(long *)lvalueCoherentFlags + 0x60))(lvalueCoherentFlags),
         iVar10 == 4)))) {
    spv::Builder::addExtension(&this->builder,"SPV_NV_shader_atomic_fp16_vector");
    spv::Builder::addCapability(&this->builder,AtomicFloat16VectorNV);
    local_8c = OpAtomicFAddEXT;
LAB_0034e30b:
    bVar6 = 1;
    bVar7 = false;
    bVar5 = 1;
    bVar4 = 1;
    bVar8 = false;
    bVar9 = false;
    bVar2 = false;
    bVar3 = false;
  }
  else {
    pBVar17 = &this->builder;
    spv::Builder::addExtension(pBVar17,"SPV_EXT_shader_atomic_float_add");
    if (uVar12 == 3) {
      spv::Builder::addExtension(pBVar17,"SPV_EXT_shader_atomic_float16_add");
      CVar16 = AtomicFloat16AddEXT;
    }
    else if (uVar12 == 1) {
      CVar16 = AtomicFloat32AddEXT;
    }
    else {
      CVar16 = AtomicFloat64AddEXT;
    }
    spv::Builder::addCapability(pBVar17,CVar16);
    local_8c = OpAtomicFAddEXT;
LAB_0034e8d4:
    bVar6 = 1;
    bVar7 = false;
    bVar5 = 1;
    bVar4 = 1;
    bVar8 = false;
    bVar9 = false;
    bVar2 = false;
    bVar3 = false;
  }
  goto LAB_0034e414;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createAtomicOperation(glslang::TOperator op, spv::Decoration /*precision*/,
    spv::Id typeId, std::vector<spv::Id>& operands, glslang::TBasicType typeProxy,
    const spv::Builder::AccessChain::CoherentFlags &lvalueCoherentFlags, const glslang::TType &opType)
{
    spv::Op opCode = spv::OpNop;

    switch (op) {
    case glslang::EOpAtomicAdd:
    case glslang::EOpImageAtomicAdd:
    case glslang::EOpAtomicCounterAdd:
        opCode = spv::OpAtomicIAdd;
        if (typeProxy == glslang::EbtFloat16 || typeProxy == glslang::EbtFloat || typeProxy == glslang::EbtDouble) {
            opCode = spv::OpAtomicFAddEXT;
            if (typeProxy == glslang::EbtFloat16 &&
                (opType.getVectorSize() == 2 || opType.getVectorSize() == 4)) {
                builder.addExtension(spv::E_SPV_NV_shader_atomic_fp16_vector);
                builder.addCapability(spv::CapabilityAtomicFloat16VectorNV);
            } else {
                builder.addExtension(spv::E_SPV_EXT_shader_atomic_float_add);
                if (typeProxy == glslang::EbtFloat16) {
                    builder.addExtension(spv::E_SPV_EXT_shader_atomic_float16_add);
                    builder.addCapability(spv::CapabilityAtomicFloat16AddEXT);
                } else if (typeProxy == glslang::EbtFloat) {
                    builder.addCapability(spv::CapabilityAtomicFloat32AddEXT);
                } else {
                    builder.addCapability(spv::CapabilityAtomicFloat64AddEXT);
                }
            }
        }
        break;
    case glslang::EOpAtomicSubtract:
    case glslang::EOpAtomicCounterSubtract:
        opCode = spv::OpAtomicISub;
        break;
    case glslang::EOpAtomicMin:
    case glslang::EOpImageAtomicMin:
    case glslang::EOpAtomicCounterMin:
        if (typeProxy == glslang::EbtFloat16 || typeProxy == glslang::EbtFloat || typeProxy == glslang::EbtDouble) {
            opCode = spv::OpAtomicFMinEXT;
            if (typeProxy == glslang::EbtFloat16 &&
                (opType.getVectorSize() == 2 || opType.getVectorSize() == 4)) {
                builder.addExtension(spv::E_SPV_NV_shader_atomic_fp16_vector);
                builder.addCapability(spv::CapabilityAtomicFloat16VectorNV);
            } else {
                builder.addExtension(spv::E_SPV_EXT_shader_atomic_float_min_max);
                if (typeProxy == glslang::EbtFloat16)
                    builder.addCapability(spv::CapabilityAtomicFloat16MinMaxEXT);
                else if (typeProxy == glslang::EbtFloat)
                    builder.addCapability(spv::CapabilityAtomicFloat32MinMaxEXT);
                else
                    builder.addCapability(spv::CapabilityAtomicFloat64MinMaxEXT);
            }
        } else if (typeProxy == glslang::EbtUint || typeProxy == glslang::EbtUint64) {
            opCode = spv::OpAtomicUMin;
        } else {
            opCode = spv::OpAtomicSMin;
        }
        break;
    case glslang::EOpAtomicMax:
    case glslang::EOpImageAtomicMax:
    case glslang::EOpAtomicCounterMax:
        if (typeProxy == glslang::EbtFloat16 || typeProxy == glslang::EbtFloat || typeProxy == glslang::EbtDouble) {
            opCode = spv::OpAtomicFMaxEXT;
            if (typeProxy == glslang::EbtFloat16 &&
                (opType.getVectorSize() == 2 || opType.getVectorSize() == 4)) {
                builder.addExtension(spv::E_SPV_NV_shader_atomic_fp16_vector);
                builder.addCapability(spv::CapabilityAtomicFloat16VectorNV);
            } else {
                builder.addExtension(spv::E_SPV_EXT_shader_atomic_float_min_max);
                if (typeProxy == glslang::EbtFloat16)
                    builder.addCapability(spv::CapabilityAtomicFloat16MinMaxEXT);
                else if (typeProxy == glslang::EbtFloat)
                    builder.addCapability(spv::CapabilityAtomicFloat32MinMaxEXT);
                else
                    builder.addCapability(spv::CapabilityAtomicFloat64MinMaxEXT);
            }
        } else if (typeProxy == glslang::EbtUint || typeProxy == glslang::EbtUint64) {
            opCode = spv::OpAtomicUMax;
        } else {
            opCode = spv::OpAtomicSMax;
        }
        break;
    case glslang::EOpAtomicAnd:
    case glslang::EOpImageAtomicAnd:
    case glslang::EOpAtomicCounterAnd:
        opCode = spv::OpAtomicAnd;
        break;
    case glslang::EOpAtomicOr:
    case glslang::EOpImageAtomicOr:
    case glslang::EOpAtomicCounterOr:
        opCode = spv::OpAtomicOr;
        break;
    case glslang::EOpAtomicXor:
    case glslang::EOpImageAtomicXor:
    case glslang::EOpAtomicCounterXor:
        opCode = spv::OpAtomicXor;
        break;
    case glslang::EOpAtomicExchange:
    case glslang::EOpImageAtomicExchange:
    case glslang::EOpAtomicCounterExchange:
        if ((typeProxy == glslang::EbtFloat16) && 
            (opType.getVectorSize() == 2 || opType.getVectorSize() == 4)) {
                builder.addExtension(spv::E_SPV_NV_shader_atomic_fp16_vector);
                builder.addCapability(spv::CapabilityAtomicFloat16VectorNV);
        }

        opCode = spv::OpAtomicExchange;
        break;
    case glslang::EOpAtomicCompSwap:
    case glslang::EOpImageAtomicCompSwap:
    case glslang::EOpAtomicCounterCompSwap:
        opCode = spv::OpAtomicCompareExchange;
        break;
    case glslang::EOpAtomicCounterIncrement:
        opCode = spv::OpAtomicIIncrement;
        break;
    case glslang::EOpAtomicCounterDecrement:
        opCode = spv::OpAtomicIDecrement;
        break;
    case glslang::EOpAtomicCounter:
    case glslang::EOpImageAtomicLoad:
    case glslang::EOpAtomicLoad:
        opCode = spv::OpAtomicLoad;
        break;
    case glslang::EOpAtomicStore:
    case glslang::EOpImageAtomicStore:
        opCode = spv::OpAtomicStore;
        break;
    default:
        assert(0);
        break;
    }

    if (typeProxy == glslang::EbtInt64 || typeProxy == glslang::EbtUint64)
        builder.addCapability(spv::CapabilityInt64Atomics);

    // Sort out the operands
    //  - mapping from glslang -> SPV
    //  - there are extra SPV operands that are optional in glslang
    //  - compare-exchange swaps the value and comparator
    //  - compare-exchange has an extra memory semantics
    //  - EOpAtomicCounterDecrement needs a post decrement
    spv::Id pointerId = 0, compareId = 0, valueId = 0;
    // scope defaults to Device in the old model, QueueFamilyKHR in the new model
    spv::Id scopeId;
    if (glslangIntermediate->usingVulkanMemoryModel()) {
        scopeId = builder.makeUintConstant(spv::ScopeQueueFamilyKHR);
    } else {
        scopeId = builder.makeUintConstant(spv::ScopeDevice);
    }
    // semantics default to relaxed
    spv::Id semanticsId = builder.makeUintConstant(lvalueCoherentFlags.isVolatile() &&
        glslangIntermediate->usingVulkanMemoryModel() ?
                                                    spv::MemorySemanticsVolatileMask :
                                                    spv::MemorySemanticsMaskNone);
    spv::Id semanticsId2 = semanticsId;

    pointerId = operands[0];
    if (opCode == spv::OpAtomicIIncrement || opCode == spv::OpAtomicIDecrement) {
        // no additional operands
    } else if (opCode == spv::OpAtomicCompareExchange) {
        compareId = operands[1];
        valueId = operands[2];
        if (operands.size() > 3) {
            scopeId = operands[3];
            semanticsId = builder.makeUintConstant(
                builder.getConstantScalar(operands[4]) | builder.getConstantScalar(operands[5]));
            semanticsId2 = builder.makeUintConstant(
                builder.getConstantScalar(operands[6]) | builder.getConstantScalar(operands[7]));
        }
    } else if (opCode == spv::OpAtomicLoad) {
        if (operands.size() > 1) {
            scopeId = operands[1];
            semanticsId = builder.makeUintConstant(
                builder.getConstantScalar(operands[2]) | builder.getConstantScalar(operands[3]));
        }
    } else {
        // atomic store or RMW
        valueId = operands[1];
        if (operands.size() > 2) {
            scopeId = operands[2];
            semanticsId = builder.makeUintConstant
                (builder.getConstantScalar(operands[3]) | builder.getConstantScalar(operands[4]));
        }
    }

    // Check for capabilities
    unsigned semanticsImmediate = builder.getConstantScalar(semanticsId) | builder.getConstantScalar(semanticsId2);
    if (semanticsImmediate & (spv::MemorySemanticsMakeAvailableKHRMask |
                              spv::MemorySemanticsMakeVisibleKHRMask |
                              spv::MemorySemanticsOutputMemoryKHRMask |
                              spv::MemorySemanticsVolatileMask)) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelKHR);
    }

    if (builder.getConstantScalar(scopeId) == spv::ScopeQueueFamily) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelKHR);
    }

    if (glslangIntermediate->usingVulkanMemoryModel() && builder.getConstantScalar(scopeId) == spv::ScopeDevice) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelDeviceScopeKHR);
    }

    std::vector<spv::Id> spvAtomicOperands;  // hold the spv operands
    spvAtomicOperands.reserve(6);
    spvAtomicOperands.push_back(pointerId);
    spvAtomicOperands.push_back(scopeId);
    spvAtomicOperands.push_back(semanticsId);
    if (opCode == spv::OpAtomicCompareExchange) {
        spvAtomicOperands.push_back(semanticsId2);
        spvAtomicOperands.push_back(valueId);
        spvAtomicOperands.push_back(compareId);
    } else if (opCode != spv::OpAtomicLoad && opCode != spv::OpAtomicIIncrement && opCode != spv::OpAtomicIDecrement) {
        spvAtomicOperands.push_back(valueId);
    }

    if (opCode == spv::OpAtomicStore) {
        builder.createNoResultOp(opCode, spvAtomicOperands);
        return 0;
    } else {
        spv::Id resultId = builder.createOp(opCode, typeId, spvAtomicOperands);

        // GLSL and HLSL atomic-counter decrement return post-decrement value,
        // while SPIR-V returns pre-decrement value. Translate between these semantics.
        if (op == glslang::EOpAtomicCounterDecrement)
            resultId = builder.createBinOp(spv::OpISub, typeId, resultId, builder.makeIntConstant(1));

        return resultId;
    }
}